

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O0

void __thiscall ProxyClient::~ProxyClient(ProxyClient *this)

{
  function<void_()> local_30;
  ProxyClient *local_10;
  ProxyClient *this_local;
  
  local_10 = this;
  free(this->m_sendBuffer);
  std::function<void_()>::function(&local_30,(nullptr_t)0x0);
  stop(this,&local_30);
  std::function<void_()>::~function(&local_30);
  clear(this);
  std::
  unordered_map<unsigned_int,_ProxyClient::SessionData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ProxyClient::SessionData>_>_>
  ::~unordered_map(&this->m_sessionDataMap);
  net_uv::UVTimer::~UVTimer(&this->m_update);
  net_uv::UVLoop::~UVLoop(&this->m_loop);
  std::function<void_()>::~function(&this->m_stopCall);
  std::__cxx11::string::~string((string *)&this->m_password);
  std::__cxx11::string::~string((string *)&this->m_username);
  std::__cxx11::string::~string((string *)&this->m_remoteIP);
  std::unique_ptr<Cypher,_std::default_delete<Cypher>_>::~unique_ptr(&this->m_cypher);
  std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::~unique_ptr(&this->m_pipe);
  std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::~unique_ptr
            (&this->m_tcpSvr);
  return;
}

Assistant:

ProxyClient::~ProxyClient()
{
	fc_free(m_sendBuffer);
	stop(NULL);
	clear();
}